

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Declaration::Id::Builder::initUid(Builder *__return_storage_ptr__,Builder *this)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_28.pointer = (this->_builder).pointers + 1;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initStruct(&__return_storage_ptr__->_builder,&local_28,(StructSize)0x2);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::compiler::LocatedInteger::Builder Declaration::Id::Builder::initUid() {
  _builder.setDataField<Declaration::Id::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Declaration::Id::UID);
  return ::capnp::_::PointerHelpers< ::capnp::compiler::LocatedInteger>::init(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS));
}